

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_losertree.cpp
# Opt level: O1

void mergesort_losertree_parallel<256u>(uchar **strings,size_t n,uchar **tmp)

{
  ostream *poVar1;
  ulong uVar2;
  uchar *puVar3;
  long lVar4;
  uchar **ppuVar5;
  undefined1 auVar6 [16];
  double dVar7;
  loser_tree<unsigned_char_*> tree;
  array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> ranges;
  loser_tree<unsigned_char_*> local_1040;
  pair<unsigned_char_**,_unsigned_long> local_1028 [255];
  uchar **local_38;
  long local_30;
  
  if (n < 0x10000) {
    mergesort_4way_parallel(strings,n,tmp);
    return;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"mergesort_losertree_parallel",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(), n=",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  auVar6._8_4_ = (int)(n >> 0x20);
  auVar6._0_8_ = n;
  auVar6._12_4_ = 0x45300000;
  dVar7 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.00390625;
  uVar2 = (ulong)dVar7;
  uVar2 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  memset(local_1028,0,0x1000);
  lVar4 = 8;
  ppuVar5 = strings;
  do {
    *(uchar ***)((long)local_1028 + lVar4 + -8) = ppuVar5;
    *(ulong *)((long)&local_1028[0].first + lVar4) = uVar2;
    ppuVar5 = ppuVar5 + uVar2;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0xff8);
  local_38 = strings + uVar2 * 0xff;
  local_30 = uVar2 * -0xff + n;
  lVar4 = 0;
  do {
    ppuVar5 = *(uchar ***)((long)&local_1028[0].first + lVar4);
    mergesort_losertree_parallel<256u>
              (ppuVar5,*(size_t *)((long)&local_1028[0].second + lVar4),
               (uchar **)(((long)ppuVar5 - (long)strings) + (long)tmp));
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x1000);
  loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
            ((loser_tree<unsigned_char*> *)&local_1040,local_1028,
             (pair<unsigned_char_**,_unsigned_long> *)&stack0xffffffffffffffd8);
  if (local_1040._nonempty_streams != 0) {
    ppuVar5 = tmp;
    do {
      puVar3 = loser_tree<unsigned_char_*>::min(&local_1040);
      *ppuVar5 = puVar3;
      ppuVar5 = ppuVar5 + 1;
    } while (local_1040._nonempty_streams != 0);
  }
  memcpy(strings,tmp,n << 3);
  loser_tree<unsigned_char_*>::~loser_tree(&local_1040);
  return;
}

Assistant:

static void
mergesort_losertree_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 0x10000) {
		mergesort_4way_parallel(strings, n, tmp);
		return;
	}
	debug() << __func__ << "(), n="<<n<<"\n";
	const size_t split = size_t(double(n) / double(K));
	std::array<std::pair<unsigned char**, size_t>, K> ranges;
	for (unsigned i=0; i < K-1; ++i) {
		ranges[i] = std::make_pair(strings+i*split, split);
	}
	ranges[K-1] = std::make_pair(strings+(K-1)*split, n-(K-1)*split);
#pragma omp parallel for
	for (unsigned i=0; i < K; ++i) {
		mergesort_losertree_parallel<K>(ranges[i].first, ranges[i].second,
				tmp+(ranges[i].first-strings));
	}
	unsigned char** result = tmp;
	loser_tree<unsigned char*> tree(ranges.begin(), ranges.end());
	while (tree._nonempty_streams) { *result++ = tree.min(); }
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}